

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O1

uint __thiscall
Lib::
BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
::bubbleDown(BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
             *this,uint index)

{
  uint64_t uVar1;
  uint64_t uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  Binding *pBVar8;
  Binding *pBVar9;
  
  uVar5 = (ulong)index;
  uVar6 = index * 2;
  uVar7 = this->_size;
  if (uVar6 <= uVar7) {
    do {
      if (uVar6 == uVar7) {
LAB_0037d6b8:
        pBVar8 = this->_data1;
        if (pBVar8[uVar6].var <= pBVar8[uVar5].var) {
          return (uint)uVar5;
        }
        pBVar9 = pBVar8 + uVar5;
        pBVar8 = pBVar8 + uVar6;
        uVar7 = pBVar9->var;
        uVar4 = *(undefined4 *)&pBVar9->field_0x4;
        uVar1 = (pBVar9->term)._content;
        uVar3 = *(undefined4 *)&pBVar8->field_0x4;
        uVar2 = (pBVar8->term)._content;
        pBVar9->var = pBVar8->var;
        *(undefined4 *)&pBVar9->field_0x4 = uVar3;
        (pBVar9->term)._content = uVar2;
        pBVar8->var = uVar7;
        *(undefined4 *)&pBVar8->field_0x4 = uVar4;
        (pBVar8->term)._content = uVar1;
        index = uVar6;
      }
      else {
        pBVar8 = this->_data1;
        index = uVar6 | 1;
        if (pBVar8[index].var <= pBVar8[uVar5].var) goto LAB_0037d6b8;
        pBVar9 = pBVar8 + uVar5;
        if (pBVar8[index].var < pBVar8[uVar6].var) {
          pBVar8 = pBVar8 + uVar6;
          uVar7 = pBVar9->var;
          uVar4 = *(undefined4 *)&pBVar9->field_0x4;
          uVar1 = (pBVar9->term)._content;
          uVar3 = *(undefined4 *)&pBVar8->field_0x4;
          uVar2 = (pBVar8->term)._content;
          pBVar9->var = pBVar8->var;
          *(undefined4 *)&pBVar9->field_0x4 = uVar3;
          (pBVar9->term)._content = uVar2;
          pBVar8->var = uVar7;
          *(undefined4 *)&pBVar8->field_0x4 = uVar4;
          (pBVar8->term)._content = uVar1;
          index = uVar6;
        }
        else {
          pBVar8 = pBVar8 + index;
          uVar7 = pBVar9->var;
          uVar4 = *(undefined4 *)&pBVar9->field_0x4;
          uVar1 = (pBVar9->term)._content;
          uVar3 = *(undefined4 *)&pBVar8->field_0x4;
          uVar2 = (pBVar8->term)._content;
          pBVar9->var = pBVar8->var;
          *(undefined4 *)&pBVar9->field_0x4 = uVar3;
          (pBVar9->term)._content = uVar2;
          pBVar8->var = uVar7;
          *(undefined4 *)&pBVar8->field_0x4 = uVar4;
          (pBVar8->term)._content = uVar1;
        }
      }
      uVar5 = (ulong)index;
      uVar6 = index * 2;
      uVar7 = this->_size;
    } while (uVar6 <= uVar7);
  }
  return index;
}

Assistant:

unsigned bubbleDown(unsigned index)
  {
    ASS(index>0 && index<=_size);
    unsigned nextIndex=index<<1;
    while(nextIndex<=_size) {
      if(nextIndex!=_size && Comparator::compare(_data1[index], _data1[nextIndex|1])==GREATER) {
	if(Comparator::compare(_data1[nextIndex|1], _data1[nextIndex])==GREATER) {
	  std::swap(_data1[index], _data1[nextIndex]);
	} else {
	  std::swap(_data1[index], _data1[nextIndex|1]);
	  nextIndex|=1;
	}
      } else if(Comparator::compare(_data1[index], _data1[nextIndex])==GREATER) {
	std::swap(_data1[index], _data1[nextIndex]);
      } else {
	return index;
      }
      index=nextIndex;
      nextIndex=index<<1;
    }
    return index;
  }